

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O1

string * __thiscall
tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  char *__s;
  size_t sVar1;
  long local_20;
  
  __s = (char *)(**this)(*(undefined4 *)((long)this + 8));
  if (__s == (char *)0x0) {
    local_20 = (long)*(int *)((long)this + 8);
    Hex<4ul>::toString_abi_cxx11_(__return_storage_ptr__,&local_20);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString (void) const
	{
		const char* name = m_getName(m_value);
		if (name)
			return std::string(name);
		else
			return Hex<NumBytes*2>((deUint64)m_value).toString();
	}